

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS
ref_cavity_find_face(REF_CAVITY ref_cavity,REF_INT *nodes,REF_INT *found_face,REF_BOOL *reversed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_BOOL RVar5;
  long lVar6;
  int *piVar7;
  
  *found_face = -1;
  if (0 < (long)ref_cavity->maxface) {
    piVar7 = ref_cavity->f2n + 2;
    lVar6 = 0;
    do {
      iVar1 = piVar7[-2];
      if (iVar1 != -1) {
        iVar2 = *nodes;
        if ((((iVar2 == iVar1) && (nodes[1] == piVar7[-1])) && (nodes[2] == *piVar7)) ||
           (((iVar3 = nodes[1], iVar3 == iVar1 && (nodes[2] == piVar7[-1])) && (iVar2 == *piVar7))))
        {
LAB_001ee2ca:
          RVar5 = 0;
        }
        else {
          iVar4 = nodes[2];
          if (iVar4 == iVar1) {
            if ((iVar2 == piVar7[-1]) && (iVar3 == *piVar7)) goto LAB_001ee2ca;
            if (((iVar4 != iVar1) || (iVar3 != piVar7[-1])) || (iVar2 != *piVar7))
            goto LAB_001ee298;
          }
          else {
LAB_001ee298:
            if ((((iVar3 != iVar1) || (iVar2 != piVar7[-1])) || (iVar4 != *piVar7)) &&
               (((iVar2 != iVar1 || (iVar4 != piVar7[-1])) || (iVar3 != *piVar7))))
            goto LAB_001ee2b8;
          }
          RVar5 = 1;
        }
        *found_face = (REF_INT)lVar6;
        *reversed = RVar5;
        return 0;
      }
LAB_001ee2b8:
      lVar6 = lVar6 + 1;
      piVar7 = piVar7 + 3;
    } while (ref_cavity->maxface != lVar6);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_find_face(REF_CAVITY ref_cavity, REF_INT *nodes,
                                        REF_INT *found_face,
                                        REF_BOOL *reversed) {
  REF_INT face;

  *found_face = REF_EMPTY;

  each_ref_cavity_valid_face(ref_cavity, face) {
    if ((nodes[0] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[1] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[2] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 2, face))) {
      *found_face = face;
      *reversed = REF_FALSE;
      return REF_SUCCESS;
    }
    if ((nodes[2] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[1] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[0] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 2, face))) {
      *found_face = face;
      *reversed = REF_TRUE;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}